

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

int listincludes(char *list,char *needle,int needlelen)

{
  bool bVar1;
  int iVar2;
  char *pcStack_40;
  int len;
  char *end;
  char *start;
  char *s;
  int offset;
  int needlelen_local;
  char *needle_local;
  char *list_local;
  
  s._0_4_ = 0;
  start = list;
  s._4_4_ = needlelen;
  _offset = needle;
  needle_local = list;
  while( true ) {
    bVar1 = parselist(&start,&end,&stack0xffffffffffffffc0,&listquotestart,&listquoteend);
    if (!bVar1) {
      return -1;
    }
    iVar2 = (int)pcStack_40 - (int)end;
    if ((s._4_4_ == iVar2) && (iVar2 = strncmp(_offset,end,(long)iVar2), iVar2 == 0)) break;
    s._0_4_ = (int)s + 1;
  }
  return (int)s;
}

Assistant:

int listincludes(const char *list, const char *needle, int needlelen)
{
    int offset = 0;
    for(const char *s = list, *start, *end; parselist(s, start, end);)
    {
        int len = end - start;
        if(needlelen == len && !strncmp(needle, start, len)) return offset;
        offset++;
    }
    return -1;
}